

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O2

void __thiscall KDIS::KDataStream::ReadFromString(KDataStream *this,KString *S)

{
  istream *piVar1;
  KUINT8 o;
  KStringStream ss;
  uint auStack_188 [92];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)S,_S_out|_S_in);
  while( true ) {
    *(uint *)((long)auStack_188 + *(long *)(_ss + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(_ss + -0x18)) & 0xffffffb5 | 8;
    piVar1 = std::operator>>((istream *)&ss,(char *)&o);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->m_vBuffer,&o);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void KDataStream::ReadFromString( const KString & S )
{
    KStringStream ss( S );

    KUINT8 o;
    while( ss >> hex >> o )
    {
        m_vBuffer.push_back( o );
    }
}